

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_write.c
# Opt level: O0

int main(int argc,char **argv)

{
  ssize_t sVar1;
  char **in_RSI;
  int in_EDI;
  uint16_t unaff_retaddr;
  nettlp_pcie_cfg ntpc;
  uint32_t data;
  uint16_t addr;
  int size;
  int ch;
  int ret;
  nettlp_pcie_cfg *in_stack_ffffffffffffffc8;
  undefined1 local_30 [4];
  undefined1 auStack_2c [8];
  undefined4 local_24;
  undefined2 local_1e;
  int local_1c;
  int local_18;
  int local_14;
  undefined4 uVar2;
  
  uVar2 = 0;
  local_1c = 0;
  local_1e = 0;
  local_24 = 0;
  memset(local_30,0,0xc);
  while (local_18 = getopt(in_EDI,in_RSI,"r:l:a:d:s:h"), local_18 != -1) {
    in_stack_ffffffffffffffc8 = (nettlp_pcie_cfg *)(ulong)(local_18 - 0x61);
    switch(in_stack_ffffffffffffffc8) {
    case (nettlp_pcie_cfg *)0x0:
      local_14 = __isoc99_sscanf(_optarg,"0x%hx",&local_1e);
      if (local_14 < 1) {
        fprintf(_stderr,"invalid address\n");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x3:
      local_14 = __isoc99_sscanf(_optarg,"0x%x",&local_24);
      if (local_14 < 1) {
        fprintf(_stderr,"invalid data\n");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x7:
    default:
      usage();
      return -1;
    case (nettlp_pcie_cfg *)0xb:
      local_14 = inet_pton(2,_optarg,auStack_2c);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x11:
      local_14 = inet_pton(2,_optarg,local_30);
      if (local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case (nettlp_pcie_cfg *)0x12:
      local_1c = atoi(_optarg);
      if ((local_1c < 0) || (4 < local_1c)) {
        fprintf(_stderr,"invalid size\n");
        return -1;
      }
    }
  }
  local_14 = nettlp_pcie_cfg_init(in_stack_ffffffffffffffc8);
  if (local_14 < 0) {
    perror("nettlp_pcie_cfg_init");
    return -1;
  }
  sVar1 = nettlp_pcie_cfg_write
                    ((nettlp_pcie_cfg *)ntpc._0_8_,unaff_retaddr,(void *)CONCAT44(uVar2,in_EDI),
                     (size_t)in_RSI);
  local_14 = (int)sVar1;
  if (local_14 < 0) {
    perror("nettlp_pcie_cfg_write");
    return -1;
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	int size = 0;
	uint16_t addr = 0;
	uint32_t data = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:d:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 'd':
			ret = sscanf(optarg, "0x%x", &data);
			if (ret < 1) {
				fprintf(stderr, "invalid data\n");
				return -1;
			}
			break;

		case 's':
			size = atoi(optarg);
			if (size < 0 || size > 4) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_write(&ntpc, addr, &data, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_write");
		return -1;
	}
	
	return 0;
}